

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  float fVar3;
  float fVar4;
  BBox1f BVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  BBox3fa *pBVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  undefined4 uVar24;
  BufferView<embree::Vec3fa> *pBVar25;
  long lVar26;
  int i;
  size_t sVar27;
  ulong uVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar66;
  float fVar69;
  float fVar80;
  float fVar83;
  Vec3fa n0;
  undefined1 auVar70 [16];
  float fVar67;
  float fVar68;
  float fVar81;
  float fVar82;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar88;
  float fVar89;
  float fVar100;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  float fVar117;
  float fVar119;
  Vec3ff v3;
  float fVar118;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar122;
  uint uVar123;
  float fVar130;
  uint uVar131;
  float fVar132;
  float fVar133;
  uint uVar134;
  uint uVar135;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar129;
  float fVar136;
  float fVar137;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar142;
  float fVar146;
  float fVar147;
  float fVar152;
  float fVar153;
  vfloat4 a_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar155;
  float fVar160;
  float fVar161;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar165 [16];
  float fVar173;
  uint uVar174;
  uint uVar176;
  uint uVar177;
  uint uVar178;
  undefined1 auVar175 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar182;
  float fVar183;
  Vec3fa n1;
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined1 local_368 [8];
  undefined8 uStack_360;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  undefined1 local_338 [16];
  undefined1 local_318 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  size_t local_250;
  size_t local_248;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  anon_class_16_2_07cfa4d6 local_f0;
  ulong local_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  fVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar4 = time_range->lower;
  if (time_range->lower <= fVar3) {
    fVar4 = fVar3;
  }
  fVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper;
  if (time_range->upper <= fVar3) {
    fVar3 = time_range->upper;
  }
  if (fVar4 <= fVar3) {
    uVar28 = r->_begin;
    local_1e8 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_1f8 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_208 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    local_218 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_250 = __return_storage_ptr__->end;
    local_248 = k;
    if (uVar28 < r->_end) {
      do {
        BVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        fVar147 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .super_Geometry.fnumTimeSegments;
        fVar31 = BVar5.lower;
        fVar88 = BVar5.upper - fVar31;
        fVar30 = floorf(((fVar4 - fVar31) / fVar88) * 1.0000002 * fVar147);
        fVar31 = ceilf(((fVar3 - fVar31) / fVar88) * 0.99999976 * fVar147);
        uVar29 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                     super_CurveGeometry.super_Geometry.field_0x58 +
                          *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                    super_CurveGeometry.field_0x68 * uVar28);
        uVar17 = (ulong)(uVar29 + 3);
        pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 vertices.items;
        if (uVar17 < (pBVar6->super_RawBufferView).num) {
          fVar88 = 0.0;
          if (0.0 <= fVar30) {
            fVar88 = fVar30;
          }
          uVar19 = (uint)fVar88;
          if (fVar147 <= fVar31) {
            fVar31 = fVar147;
          }
          uVar21 = (uint)fVar31;
          bVar9 = uVar21 < uVar19;
          if (uVar19 <= uVar21) {
            uVar20 = (ulong)(int)uVar19;
            pBVar7 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                     super_CurveGeometry.normals.items;
            fVar31 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                     super_CurveGeometry.maxRadiusScale;
            pBVar25 = pBVar7;
            do {
              pcVar8 = pBVar6[uVar20].super_RawBufferView.ptr_ofs;
              sVar27 = pBVar6[uVar20].super_RawBufferView.stride;
              lVar26 = sVar27 * uVar29;
              lVar22 = sVar27 * (uVar29 + 1);
              lVar18 = sVar27 * (uVar29 + 2);
              fVar30 = (float)DAT_01ff0930;
              fVar88 = DAT_01ff0930._4_4_;
              fVar69 = DAT_01ff0930._8_4_;
              fVar89 = DAT_01ff0930._12_4_;
              auVar70._4_4_ = -(uint)(fVar88 <= ABS(*(float *)(pcVar8 + lVar22 + 0xc)));
              auVar70._0_4_ = -(uint)(fVar30 <= ABS(*(float *)(pcVar8 + lVar26 + 0xc)));
              auVar70._8_4_ = -(uint)(fVar69 <= ABS(*(float *)(pcVar8 + lVar18 + 0xc)));
              auVar70._12_4_ = -(uint)(fVar89 <= ABS(*(float *)(pcVar8 + sVar27 * uVar17 + 0xc)));
              iVar23 = movmskps((int)pBVar25,auVar70);
              if (iVar23 != 0) {
LAB_00ab54b8:
                if (!bVar9) goto LAB_00ab5961;
                break;
              }
              pfVar1 = (float *)(pcVar8 + lVar26);
              fVar66 = *pfVar1;
              fVar80 = pfVar1[1];
              fVar83 = pfVar1[2];
              fVar32 = pfVar1[3];
              auVar156._0_4_ = -(uint)(fVar66 < fVar30 && -1.844e+18 < fVar66);
              auVar156._4_4_ = -(uint)(fVar80 < fVar88 && -1.844e+18 < fVar80);
              auVar156._8_4_ = -(uint)(fVar83 < fVar69 && -1.844e+18 < fVar83);
              auVar156._12_4_ = -(uint)(fVar32 < fVar89 && -1.844e+18 < fVar32);
              uVar24 = movmskps(0,auVar156);
              pBVar25 = (BufferView<embree::Vec3fa> *)
                        (ulong)CONCAT31((int3)((uint)uVar24 >> 8),~(byte)uVar24);
              if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab54b8;
              pfVar1 = (float *)(pcVar8 + lVar22);
              fVar130 = *pfVar1;
              fVar132 = pfVar1[1];
              fVar100 = pfVar1[2];
              fVar33 = pfVar1[3];
              auVar71._0_4_ = -(uint)(fVar130 < fVar30 && -1.844e+18 < fVar130);
              auVar71._4_4_ = -(uint)(fVar132 < fVar88 && -1.844e+18 < fVar132);
              auVar71._8_4_ = -(uint)(fVar100 < fVar69 && -1.844e+18 < fVar100);
              auVar71._12_4_ = -(uint)(fVar33 < fVar89 && -1.844e+18 < fVar33);
              uVar24 = movmskps((int)lVar22,auVar71);
              if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab54b8;
              pauVar2 = (undefined1 (*) [12])(pcVar8 + lVar18);
              fVar118 = *(float *)*pauVar2;
              fVar120 = *(float *)(*pauVar2 + 4);
              fVar122 = *(float *)(*pauVar2 + 8);
              auVar15 = *pauVar2;
              fVar34 = *(float *)pauVar2[1];
              auVar90._0_4_ = -(uint)(fVar118 < fVar30 && -1.844e+18 < fVar118);
              auVar90._4_4_ = -(uint)(fVar120 < fVar88 && -1.844e+18 < fVar120);
              auVar90._8_4_ = -(uint)(fVar122 < fVar69 && -1.844e+18 < fVar122);
              auVar90._12_4_ = -(uint)(fVar34 < fVar89 && -1.844e+18 < fVar34);
              uVar24 = movmskps(CONCAT31((int3)((uint)uVar24 >> 8),~(byte)uVar24),auVar90);
              if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab54b8;
              auVar70 = *(undefined1 (*) [16])(pcVar8 + sVar27 * uVar17);
              fVar114 = auVar70._0_4_;
              fVar117 = auVar70._4_4_;
              fVar119 = auVar70._8_4_;
              fVar121 = auVar70._12_4_;
              auVar91._0_4_ = -(uint)(fVar114 < fVar30 && -1.844e+18 < fVar114);
              auVar91._4_4_ = -(uint)(fVar117 < fVar88 && -1.844e+18 < fVar117);
              auVar91._8_4_ = -(uint)(fVar119 < fVar69 && -1.844e+18 < fVar119);
              auVar91._12_4_ = -(uint)(fVar121 < fVar89 && -1.844e+18 < fVar121);
              uVar24 = movmskps(CONCAT31((int3)((uint)uVar24 >> 8),~(byte)uVar24),auVar91);
              if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab54b8;
              pcVar8 = pBVar7[uVar20].super_RawBufferView.ptr_ofs;
              sVar27 = pBVar7[uVar20].super_RawBufferView.stride;
              lVar18 = sVar27 * uVar29;
              pfVar1 = (float *)(pcVar8 + lVar18);
              fVar133 = *pfVar1;
              fVar137 = pfVar1[1];
              fVar167 = pfVar1[2];
              auVar179._0_4_ = -(uint)(fVar133 < fVar30 && -1.844e+18 < fVar133);
              auVar179._4_4_ = -(uint)(fVar137 < fVar88 && -1.844e+18 < fVar137);
              auVar179._8_4_ = -(uint)(fVar167 < fVar69 && -1.844e+18 < fVar167);
              auVar179._12_4_ = -(uint)(pfVar1[3] < fVar89 && -1.844e+18 < pfVar1[3]);
              uVar24 = movmskps((int)lVar18,auVar179);
              if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab54b8;
              lVar18 = sVar27 * (uVar29 + 1);
              pfVar1 = (float *)(pcVar8 + lVar18);
              fVar170 = *pfVar1;
              fVar163 = pfVar1[1];
              fVar146 = pfVar1[2];
              auVar181._0_4_ = -(uint)(fVar170 < fVar30 && -1.844e+18 < fVar170);
              auVar181._4_4_ = -(uint)(fVar163 < fVar88 && -1.844e+18 < fVar163);
              auVar181._8_4_ = -(uint)(fVar146 < fVar69 && -1.844e+18 < fVar146);
              auVar181._12_4_ = -(uint)(pfVar1[3] < fVar89 && -1.844e+18 < pfVar1[3]);
              uVar24 = movmskps((int)lVar18,auVar181);
              if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab54b8;
              fVar32 = fVar32 * fVar31;
              fVar33 = fVar33 * fVar31;
              fVar34 = fVar34 * fVar31;
              fVar121 = fVar121 * fVar31;
              lVar18 = sVar27 * (uVar29 + 2);
              pfVar1 = (float *)(pcVar8 + lVar18);
              fVar152 = *pfVar1;
              fVar153 = pfVar1[1];
              fVar155 = pfVar1[2];
              pfVar1 = (float *)(pcVar8 + sVar27 * uVar17);
              fVar173 = *pfVar1;
              fVar182 = pfVar1[1];
              fVar183 = pfVar1[2];
              fVar105 = (fVar118 * 0.5 + fVar114 * 0.0 + fVar130 * 0.0) - fVar66 * 0.5;
              fVar111 = (fVar120 * 0.5 + fVar117 * 0.0 + fVar132 * 0.0) - fVar80 * 0.5;
              fVar112 = (fVar122 * 0.5 + fVar119 * 0.0 + fVar100 * 0.0) - fVar83 * 0.5;
              fVar113 = (fVar34 * 0.5 + fVar121 * 0.0 + fVar33 * 0.0) - fVar32 * 0.5;
              fVar154 = (fVar152 * 0.5 + fVar173 * 0.0 + fVar170 * 0.0) - fVar133 * 0.5;
              fVar160 = (fVar153 * 0.5 + fVar182 * 0.0 + fVar163 * 0.0) - fVar137 * 0.5;
              fVar161 = (fVar155 * 0.5 + fVar183 * 0.0 + fVar146 * 0.0) - fVar167 * 0.5;
              fVar35 = fVar118 * 0.0 + fVar114 * -0.0 + fVar130 + fVar66 * -0.0;
              fVar60 = fVar120 * 0.0 + fVar117 * -0.0 + fVar132 + fVar80 * -0.0;
              fVar62 = fVar122 * 0.0 + fVar119 * -0.0 + fVar100 + fVar83 * -0.0;
              fVar64 = fVar34 * 0.0 + fVar121 * -0.0 + fVar33 + fVar32 * -0.0;
              local_368._0_4_ = auVar15._0_4_;
              local_368._4_4_ = auVar15._4_4_;
              uStack_360._0_4_ = auVar15._8_4_;
              fVar162 = fVar152 * 0.0 + fVar173 * -0.0 + fVar170 + fVar133 * -0.0;
              fVar166 = fVar153 * 0.0 + fVar182 * -0.0 + fVar163 + fVar137 * -0.0;
              fVar169 = fVar155 * 0.0 + fVar183 * -0.0 + fVar146 + fVar167 * -0.0;
              fVar36 = fVar114 * -0.0 + (float)local_368._0_4_ + fVar130 * 0.0 + fVar66 * -0.0;
              fVar61 = fVar117 * -0.0 + (float)local_368._4_4_ + fVar132 * 0.0 + fVar80 * -0.0;
              fVar63 = fVar119 * -0.0 + (float)uStack_360 + fVar100 * 0.0 + fVar83 * -0.0;
              fVar65 = fVar121 * -0.0 + fVar34 + fVar33 * 0.0 + fVar32 * -0.0;
              fVar136 = fVar66 * 0.0 + ((fVar114 * 0.5 + fVar118 * 0.0) - fVar130 * 0.5);
              fVar143 = fVar80 * 0.0 + ((fVar117 * 0.5 + fVar120 * 0.0) - fVar132 * 0.5);
              fVar144 = fVar83 * 0.0 + ((fVar119 * 0.5 + fVar122 * 0.0) - fVar100 * 0.5);
              fVar145 = fVar32 * 0.0 + ((fVar121 * 0.5 + fVar34 * 0.0) - fVar33 * 0.5);
              fVar32 = fVar173 * -0.0 + fVar152 + fVar170 * 0.0 + fVar133 * -0.0;
              fVar130 = fVar182 * -0.0 + fVar153 + fVar163 * 0.0 + fVar137 * -0.0;
              fVar132 = fVar183 * -0.0 + fVar155 + fVar146 * 0.0 + fVar167 * -0.0;
              fVar66 = fVar133 * 0.0 + ((fVar173 * 0.5 + fVar152 * 0.0) - fVar170 * 0.5);
              fVar80 = fVar137 * 0.0 + ((fVar182 * 0.5 + fVar153 * 0.0) - fVar163 * 0.5);
              fVar83 = fVar167 * 0.0 + ((fVar183 * 0.5 + fVar155 * 0.0) - fVar146 * 0.5);
              fVar163 = fVar162 * fVar111 - fVar166 * fVar105;
              fVar167 = fVar166 * fVar112 - fVar169 * fVar111;
              fVar170 = fVar169 * fVar105 - fVar162 * fVar112;
              fVar33 = fVar111 * fVar154 - fVar160 * fVar105;
              fVar118 = fVar112 * fVar160 - fVar161 * fVar111;
              fVar120 = fVar105 * fVar161 - fVar154 * fVar112;
              fVar122 = fVar32 * fVar143 - fVar130 * fVar136;
              fVar114 = fVar130 * fVar144 - fVar132 * fVar143;
              fVar119 = fVar132 * fVar136 - fVar32 * fVar144;
              fVar32 = fVar143 * fVar66 - fVar80 * fVar136;
              fVar132 = fVar144 * fVar80 - fVar83 * fVar143;
              fVar100 = fVar136 * fVar83 - fVar66 * fVar144;
              fVar80 = fVar170 * fVar170 + fVar167 * fVar167 + fVar163 * fVar163;
              auVar156 = ZEXT416((uint)fVar80);
              auVar70 = rsqrtss(ZEXT416((uint)fVar80),auVar156);
              fVar66 = auVar70._0_4_;
              fVar83 = fVar66 * 1.5 - fVar66 * fVar66 * fVar80 * 0.5 * fVar66;
              fVar173 = fVar163 * fVar33 + fVar170 * fVar120 + fVar167 * fVar118;
              auVar70 = rcpss(auVar156,auVar156);
              fVar66 = (2.0 - fVar80 * auVar70._0_4_) * auVar70._0_4_;
              fVar137 = fVar119 * fVar119 + fVar114 * fVar114 + fVar122 * fVar122;
              auVar70 = ZEXT416((uint)fVar137);
              auVar156 = rsqrtss(ZEXT416((uint)fVar137),auVar70);
              fVar130 = auVar156._0_4_;
              fVar34 = fVar130 * 1.5 - fVar130 * fVar130 * fVar137 * 0.5 * fVar130;
              fVar155 = fVar122 * fVar32 + fVar119 * fVar100 + fVar114 * fVar132;
              auVar70 = rcpss(auVar70,auVar70);
              fVar130 = (2.0 - fVar137 * auVar70._0_4_) * auVar70._0_4_;
              fVar121 = fVar64 * fVar167 * fVar83;
              fVar117 = fVar64 * fVar170 * fVar83;
              fVar133 = fVar64 * fVar163 * fVar83;
              fVar146 = fVar35 - fVar121;
              fVar152 = fVar60 - fVar117;
              fVar153 = fVar62 - fVar133;
              fVar167 = fVar64 * fVar66 * (fVar80 * fVar118 - fVar173 * fVar167) * fVar83 +
                        fVar113 * fVar167 * fVar83;
              fVar170 = fVar64 * fVar66 * (fVar80 * fVar120 - fVar173 * fVar170) * fVar83 +
                        fVar113 * fVar170 * fVar83;
              fVar163 = fVar64 * fVar66 * (fVar80 * fVar33 - fVar173 * fVar163) * fVar83 +
                        fVar113 * fVar163 * fVar83;
              fVar66 = fVar65 * fVar114 * fVar34;
              fVar80 = fVar65 * fVar119 * fVar34;
              fVar83 = fVar65 * fVar122 * fVar34;
              fVar173 = fVar36 - fVar66;
              fVar182 = fVar61 - fVar80;
              fVar183 = fVar63 - fVar83;
              fVar33 = fVar65 * fVar130 * (fVar137 * fVar132 - fVar155 * fVar114) * fVar34 +
                       fVar145 * fVar114 * fVar34;
              fVar100 = fVar65 * fVar130 * (fVar137 * fVar100 - fVar155 * fVar119) * fVar34 +
                        fVar145 * fVar119 * fVar34;
              fVar118 = fVar65 * fVar130 * (fVar137 * fVar32 - fVar155 * fVar122) * fVar34 +
                        fVar145 * fVar122 * fVar34;
              fVar120 = (fVar105 - fVar167) * 0.33333334 + fVar146;
              fVar122 = (fVar111 - fVar170) * 0.33333334 + fVar152;
              fVar34 = (fVar112 - fVar163) * 0.33333334 + fVar153;
              fVar32 = fVar173 - (fVar136 - fVar33) * 0.33333334;
              fVar130 = fVar182 - (fVar143 - fVar100) * 0.33333334;
              fVar132 = fVar183 - (fVar144 - fVar118) * 0.33333334;
              lVar22 = 0;
              local_318._8_8_ = 0x7f8000007f800000;
              local_318._0_8_ = 0x7f8000007f800000;
              local_2f8._8_8_ = 0x7f8000007f800000;
              local_2f8._0_8_ = 0x7f8000007f800000;
              uStack_360 = 0x7f8000007f800000;
              local_368 = (undefined1  [8])0x7f8000007f800000;
              local_2e8 = _DAT_01feba00;
              local_338 = _DAT_01feba00;
              auVar107 = _DAT_01feba00;
              do {
                uVar19 = (uint)lVar22;
                lVar26 = lVar22 * 4;
                fVar114 = *(float *)(bezier_basis0 + lVar26 + 0x1dc);
                fVar119 = *(float *)(bezier_basis0 + lVar26 + 0x1e0);
                fVar137 = *(float *)(bezier_basis0 + lVar26 + 0x1e4);
                fVar155 = *(float *)(bezier_basis0 + lVar26 + 0x1e8);
                lVar26 = lVar22 * 4;
                fVar64 = *(float *)(bezier_basis0 + lVar26 + 0x660);
                fVar65 = *(float *)(bezier_basis0 + lVar26 + 0x664);
                fVar113 = *(float *)(bezier_basis0 + lVar26 + 0x668);
                fVar145 = *(float *)(bezier_basis0 + lVar26 + 0x66c);
                lVar26 = lVar22 * 4;
                fVar154 = *(float *)(bezier_basis0 + lVar26 + 0xae4);
                fVar160 = *(float *)(bezier_basis0 + lVar26 + 0xae8);
                fVar161 = *(float *)(bezier_basis0 + lVar26 + 0xaec);
                fVar162 = *(float *)(bezier_basis0 + lVar26 + 0xaf0);
                lVar26 = lVar22 * 4;
                fVar166 = *(float *)(bezier_basis0 + lVar26 + 0xf68);
                fVar169 = *(float *)(bezier_basis0 + lVar26 + 0xf6c);
                fVar10 = *(float *)(bezier_basis0 + lVar26 + 0xf70);
                fVar11 = *(float *)(bezier_basis0 + lVar26 + 0xf74);
                auVar138._0_4_ =
                     fVar146 * fVar114 + fVar120 * fVar64 + fVar32 * fVar154 + fVar173 * fVar166;
                auVar138._4_4_ =
                     fVar146 * fVar119 + fVar120 * fVar65 + fVar32 * fVar160 + fVar173 * fVar169;
                auVar138._8_4_ =
                     fVar146 * fVar137 + fVar120 * fVar113 + fVar32 * fVar161 + fVar173 * fVar10;
                auVar138._12_4_ =
                     fVar146 * fVar155 + fVar120 * fVar145 + fVar32 * fVar162 + fVar173 * fVar11;
                auVar148._0_4_ =
                     fVar152 * fVar114 + fVar122 * fVar64 + fVar130 * fVar154 + fVar182 * fVar166;
                auVar148._4_4_ =
                     fVar152 * fVar119 + fVar122 * fVar65 + fVar130 * fVar160 + fVar182 * fVar169;
                auVar148._8_4_ =
                     fVar152 * fVar137 + fVar122 * fVar113 + fVar130 * fVar161 + fVar182 * fVar10;
                auVar148._12_4_ =
                     fVar152 * fVar155 + fVar122 * fVar145 + fVar130 * fVar162 + fVar182 * fVar11;
                fVar67 = fVar114 * fVar153 + fVar64 * fVar34 + fVar154 * fVar132 + fVar166 * fVar183
                ;
                fVar81 = fVar119 * fVar153 + fVar65 * fVar34 + fVar160 * fVar132 + fVar169 * fVar183
                ;
                fVar84 = fVar137 * fVar153 + fVar113 * fVar34 + fVar161 * fVar132 + fVar10 * fVar183
                ;
                fVar86 = fVar155 * fVar153 + fVar145 * fVar34 + fVar162 * fVar132 + fVar11 * fVar183
                ;
                lVar26 = lVar22 * 4;
                fVar114 = *(float *)(bezier_basis0 + lVar26 + 0x13ec);
                fVar119 = *(float *)(bezier_basis0 + lVar26 + 0x13f0);
                fVar137 = *(float *)(bezier_basis0 + lVar26 + 0x13f4);
                fVar155 = *(float *)(bezier_basis0 + lVar26 + 0x13f8);
                lVar26 = lVar22 * 4;
                fVar64 = *(float *)(bezier_basis0 + lVar26 + 0x1870);
                fVar65 = *(float *)(bezier_basis0 + lVar26 + 0x1874);
                fVar113 = *(float *)(bezier_basis0 + lVar26 + 0x1878);
                fVar145 = *(float *)(bezier_basis0 + lVar26 + 0x187c);
                lVar26 = lVar22 * 4;
                fVar154 = *(float *)(bezier_basis0 + lVar26 + 0x1cf4);
                fVar160 = *(float *)(bezier_basis0 + lVar26 + 0x1cf8);
                fVar161 = *(float *)(bezier_basis0 + lVar26 + 0x1cfc);
                fVar162 = *(float *)(bezier_basis0 + lVar26 + 0x1d00);
                lVar26 = lVar22 * 4;
                fVar166 = *(float *)(bezier_basis0 + lVar26 + 0x2178);
                fVar169 = *(float *)(bezier_basis0 + lVar26 + 0x217c);
                fVar10 = *(float *)(bezier_basis0 + lVar26 + 0x2180);
                fVar11 = *(float *)(bezier_basis0 + lVar26 + 0x2184);
                fVar68 = fVar146 * fVar114 + fVar120 * fVar64 + fVar32 * fVar154 + fVar173 * fVar166
                ;
                fVar82 = fVar146 * fVar119 + fVar120 * fVar65 + fVar32 * fVar160 + fVar173 * fVar169
                ;
                fVar85 = fVar146 * fVar137 + fVar120 * fVar113 + fVar32 * fVar161 + fVar173 * fVar10
                ;
                fVar87 = fVar146 * fVar155 + fVar120 * fVar145 + fVar32 * fVar162 + fVar173 * fVar11
                ;
                fVar164 = fVar152 * fVar114 +
                          fVar122 * fVar64 + fVar130 * fVar154 + fVar182 * fVar166;
                fVar168 = fVar152 * fVar119 +
                          fVar122 * fVar65 + fVar130 * fVar160 + fVar182 * fVar169;
                fVar171 = fVar152 * fVar137 +
                          fVar122 * fVar113 + fVar130 * fVar161 + fVar182 * fVar10;
                fVar172 = fVar152 * fVar155 +
                          fVar122 * fVar145 + fVar130 * fVar162 + fVar182 * fVar11;
                fVar114 = fVar114 * fVar153 +
                          fVar64 * fVar34 + fVar154 * fVar132 + fVar166 * fVar183;
                fVar119 = fVar119 * fVar153 +
                          fVar65 * fVar34 + fVar160 * fVar132 + fVar169 * fVar183;
                fVar137 = fVar137 * fVar153 +
                          fVar113 * fVar34 + fVar161 * fVar132 + fVar10 * fVar183;
                fVar155 = fVar155 * fVar153 +
                          fVar145 * fVar34 + fVar162 * fVar132 + fVar11 * fVar183;
                uVar123 = -(uint)(uVar19 == 0);
                uVar131 = -(uint)(uVar19 == 1);
                uVar134 = -(uint)(uVar19 == 2);
                uVar135 = -(uint)(uVar19 == 3);
                uVar174 = -(uint)(uVar19 == 7);
                uVar176 = -(uint)(uVar19 == 6);
                uVar177 = -(uint)(uVar19 == 5);
                uVar178 = -(uint)(uVar19 == 4);
                auVar179 = minps(_local_368,auVar138);
                auVar90 = maxps(local_338,auVar138);
                auVar139._0_8_ =
                     CONCAT44(auVar138._4_4_ - (float)(~uVar131 & (uint)fVar82) * 0.055555556,
                              auVar138._0_4_ - (float)(~uVar123 & (uint)fVar68) * 0.055555556);
                auVar139._8_4_ = auVar138._8_4_ - (float)(~uVar134 & (uint)fVar85) * 0.055555556;
                auVar139._12_4_ = auVar138._12_4_ - (float)(~uVar135 & (uint)fVar87) * 0.055555556;
                auVar184._0_4_ = (float)(~uVar174 & (uint)fVar164) * 0.055555556 + auVar148._0_4_;
                auVar184._4_4_ = (float)(~uVar176 & (uint)fVar168) * 0.055555556 + auVar148._4_4_;
                auVar184._8_4_ = (float)(~uVar177 & (uint)fVar171) * 0.055555556 + auVar148._8_4_;
                auVar184._12_4_ = (float)(~uVar178 & (uint)fVar172) * 0.055555556 + auVar148._12_4_;
                auVar91 = minps(local_2f8,auVar148);
                auVar181 = maxps(local_2e8,auVar148);
                auVar149._0_8_ =
                     CONCAT44(auVar148._4_4_ - (float)(~uVar131 & (uint)fVar168) * 0.055555556,
                              auVar148._0_4_ - (float)(~uVar123 & (uint)fVar164) * 0.055555556);
                auVar149._8_4_ = auVar148._8_4_ - (float)(~uVar134 & (uint)fVar171) * 0.055555556;
                auVar149._12_4_ = auVar148._12_4_ - (float)(~uVar135 & (uint)fVar172) * 0.055555556;
                auVar106._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
                auVar106._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
                auVar106._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
                auVar106._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
                auVar14._4_4_ = fVar81;
                auVar14._0_4_ = fVar67;
                auVar14._8_4_ = fVar84;
                auVar14._12_4_ = fVar86;
                auVar175._0_4_ = (float)(~uVar174 & (uint)fVar114) * 0.055555556 + fVar67;
                auVar175._4_4_ = (float)(~uVar176 & (uint)fVar119) * 0.055555556 + fVar81;
                auVar175._8_4_ = (float)(~uVar177 & (uint)fVar137) * 0.055555556 + fVar84;
                auVar175._12_4_ = (float)(~uVar178 & (uint)fVar155) * 0.055555556 + fVar86;
                auVar71 = minps(local_318,auVar14);
                auVar70 = maxps(auVar107,auVar14);
                auVar157._0_8_ =
                     CONCAT44(fVar81 - (float)(~uVar131 & (uint)fVar119) * 0.055555556,
                              fVar67 - (float)(~uVar123 & (uint)fVar114) * 0.055555556);
                auVar157._8_4_ = fVar84 - (float)(~uVar134 & (uint)fVar137) * 0.055555556;
                auVar157._12_4_ = fVar86 - (float)(~uVar135 & (uint)fVar155) * 0.055555556;
                auVar37._8_4_ = auVar139._8_4_;
                auVar37._0_8_ = auVar139._0_8_;
                auVar37._12_4_ = auVar139._12_4_;
                auVar180._4_4_ = (float)(~uVar176 & (uint)fVar82) * 0.055555556 + auVar138._4_4_;
                auVar180._0_4_ = (float)(~uVar174 & (uint)fVar68) * 0.055555556 + auVar138._0_4_;
                auVar180._8_4_ = (float)(~uVar177 & (uint)fVar85) * 0.055555556 + auVar138._8_4_;
                auVar180._12_4_ = (float)(~uVar178 & (uint)fVar87) * 0.055555556 + auVar138._12_4_;
                auVar156 = minps(auVar37,auVar180);
                auVar179 = minps(auVar179,auVar156);
                auVar38._8_4_ = auVar149._8_4_;
                auVar38._0_8_ = auVar149._0_8_;
                auVar38._12_4_ = auVar149._12_4_;
                auVar156 = minps(auVar38,auVar184);
                auVar91 = minps(auVar91,auVar156);
                auVar39._8_4_ = auVar157._8_4_;
                auVar39._0_8_ = auVar157._0_8_;
                auVar39._12_4_ = auVar157._12_4_;
                auVar156 = minps(auVar39,auVar175);
                auVar156 = minps(auVar71,auVar156);
                _local_368 = _local_368 & auVar106 | ~auVar106 & auVar179;
                auVar101._0_4_ = local_2f8._0_4_ & auVar106._0_4_;
                auVar101._4_4_ = local_2f8._4_4_ & auVar106._4_4_;
                auVar101._8_4_ = local_2f8._8_4_ & auVar106._8_4_;
                auVar101._12_4_ = local_2f8._12_4_ & auVar106._12_4_;
                local_2f8 = auVar101 | ~auVar106 & auVar91;
                uVar19 = local_318._0_4_ & auVar106._0_4_ | ~auVar106._0_4_ & auVar156._0_4_;
                uVar123 = local_318._4_4_ & auVar106._4_4_ | ~auVar106._4_4_ & auVar156._4_4_;
                uVar131 = local_318._8_4_ & auVar106._8_4_ | ~auVar106._8_4_ & auVar156._8_4_;
                local_318._12_4_ =
                     local_318._12_4_ & auVar106._12_4_ | ~auVar106._12_4_ & auVar156._12_4_;
                local_318._4_4_ = uVar123;
                local_318._0_4_ = uVar19;
                local_318._8_4_ = uVar131;
                auVar156 = maxps(auVar139,auVar180);
                auVar156 = maxps(auVar90,auVar156);
                auVar71 = maxps(auVar149,auVar184);
                auVar90 = maxps(auVar181,auVar71);
                auVar71 = maxps(auVar157,auVar175);
                auVar70 = maxps(auVar70,auVar71);
                uVar176 = local_338._0_4_ & auVar106._0_4_ | ~auVar106._0_4_ & auVar156._0_4_;
                uVar177 = local_338._4_4_ & auVar106._4_4_ | ~auVar106._4_4_ & auVar156._4_4_;
                uVar178 = local_338._8_4_ & auVar106._8_4_ | ~auVar106._8_4_ & auVar156._8_4_;
                local_338._12_4_ =
                     local_338._12_4_ & auVar106._12_4_ | ~auVar106._12_4_ & auVar156._12_4_;
                local_338._4_4_ = uVar177;
                local_338._0_4_ = uVar176;
                local_338._8_4_ = uVar178;
                uVar134 = local_2e8._0_4_ & auVar106._0_4_ | ~auVar106._0_4_ & auVar90._0_4_;
                uVar135 = local_2e8._4_4_ & auVar106._4_4_ | ~auVar106._4_4_ & auVar90._4_4_;
                uVar174 = local_2e8._8_4_ & auVar106._8_4_ | ~auVar106._8_4_ & auVar90._8_4_;
                local_2e8._12_4_ =
                     local_2e8._12_4_ & auVar106._12_4_ | ~auVar106._12_4_ & auVar90._12_4_;
                local_2e8._4_4_ = uVar135;
                local_2e8._0_4_ = uVar134;
                local_2e8._8_4_ = uVar174;
                local_358 = auVar107._0_4_;
                uStack_354 = auVar107._4_4_;
                uStack_350 = auVar107._8_4_;
                uStack_34c = auVar107._12_4_;
                auVar40._0_4_ = local_358 & auVar106._0_4_;
                auVar40._4_4_ = uStack_354 & auVar106._4_4_;
                auVar40._8_4_ = uStack_350 & auVar106._8_4_;
                auVar40._12_4_ = uStack_34c & auVar106._12_4_;
                auVar107._0_4_ = ~auVar106._0_4_ & auVar70._0_4_;
                auVar107._4_4_ = ~auVar106._4_4_ & auVar70._4_4_;
                auVar107._8_4_ = ~auVar106._8_4_ & auVar70._8_4_;
                auVar107._12_4_ = ~auVar106._12_4_ & auVar70._12_4_;
                auVar107 = auVar107 | auVar40;
                lVar22 = lVar22 + 4;
              } while (lVar22 == 4);
              fVar35 = fVar35 + fVar121;
              fVar60 = fVar60 + fVar117;
              fVar62 = fVar62 + fVar133;
              fVar36 = fVar36 + fVar66;
              fVar61 = fVar61 + fVar80;
              fVar63 = fVar63 + fVar83;
              fVar66 = (fVar167 + fVar105) * 0.33333334 + fVar35;
              fVar80 = (fVar170 + fVar111) * 0.33333334 + fVar60;
              fVar83 = (fVar163 + fVar112) * 0.33333334 + fVar62;
              fVar32 = fVar36 - (fVar33 + fVar136) * 0.33333334;
              fVar130 = fVar61 - (fVar100 + fVar143) * 0.33333334;
              fVar132 = fVar63 - (fVar118 + fVar144) * 0.33333334;
              auVar41._4_4_ = local_368._0_4_;
              auVar41._0_4_ = local_368._4_4_;
              auVar41._8_4_ = local_368._12_4_;
              auVar41._12_4_ = local_368._8_4_;
              auVar70 = minps(auVar41,_local_368);
              auVar72._0_8_ = auVar70._8_8_;
              auVar72._8_4_ = auVar70._0_4_;
              auVar72._12_4_ = auVar70._4_4_;
              auVar156 = minps(auVar72,auVar70);
              auVar42._4_4_ = local_2f8._0_4_;
              auVar42._0_4_ = local_2f8._4_4_;
              auVar42._8_4_ = local_2f8._12_4_;
              auVar42._12_4_ = local_2f8._8_4_;
              auVar70 = minps(auVar42,local_2f8);
              auVar92._0_8_ = auVar70._8_8_;
              auVar92._8_4_ = auVar70._0_4_;
              auVar92._12_4_ = auVar70._4_4_;
              auVar71 = minps(auVar92,auVar70);
              auVar43._4_4_ = uVar19;
              auVar43._0_4_ = uVar123;
              auVar43._8_4_ = local_318._12_4_;
              auVar43._12_4_ = uVar131;
              auVar70 = minps(auVar43,local_318);
              auVar44._0_8_ = auVar70._8_8_;
              auVar44._8_4_ = auVar70._0_4_;
              auVar44._12_4_ = auVar70._4_4_;
              auVar104._4_4_ = auVar71._0_4_;
              auVar104._0_4_ = auVar156._0_4_;
              auVar45._4_4_ = uVar176;
              auVar45._0_4_ = uVar177;
              auVar45._8_4_ = local_338._12_4_;
              auVar45._12_4_ = uVar178;
              auVar156 = maxps(auVar45,local_338);
              auVar73._0_8_ = auVar156._8_8_;
              auVar73._8_4_ = auVar156._0_4_;
              auVar73._12_4_ = auVar156._4_4_;
              auVar71 = maxps(auVar73,auVar156);
              auVar46._4_4_ = uVar134;
              auVar46._0_4_ = uVar135;
              auVar46._8_4_ = local_2e8._12_4_;
              auVar46._12_4_ = uVar174;
              auVar156 = maxps(auVar46,local_2e8);
              auVar93._0_8_ = auVar156._8_8_;
              auVar93._8_4_ = auVar156._0_4_;
              auVar93._12_4_ = auVar156._4_4_;
              auVar90 = maxps(auVar93,auVar156);
              auVar47._4_4_ = auVar107._0_4_;
              auVar47._0_4_ = auVar107._4_4_;
              auVar47._8_4_ = auVar107._12_4_;
              auVar47._12_4_ = auVar107._8_4_;
              auVar156 = maxps(auVar47,auVar107);
              auVar48._0_8_ = auVar156._8_8_;
              auVar48._8_4_ = auVar156._0_4_;
              auVar48._12_4_ = auVar156._4_4_;
              auVar109._4_4_ = auVar90._0_4_;
              auVar109._0_4_ = auVar71._0_4_;
              lVar22 = 0;
              local_318._8_8_ = 0x7f8000007f800000;
              local_318._0_8_ = 0x7f8000007f800000;
              local_2f8._8_8_ = 0x7f8000007f800000;
              local_2f8._0_8_ = 0x7f8000007f800000;
              uStack_360 = 0x7f8000007f800000;
              local_368 = (undefined1  [8])0x7f8000007f800000;
              local_2e8 = _DAT_01feba00;
              local_338 = _DAT_01feba00;
              auVar159 = _DAT_01feba00;
              do {
                uVar19 = (uint)lVar22;
                lVar26 = lVar22 * 4;
                fVar100 = *(float *)(bezier_basis0 + lVar26 + 0x1dc);
                fVar33 = *(float *)(bezier_basis0 + lVar26 + 0x1e0);
                fVar118 = *(float *)(bezier_basis0 + lVar26 + 0x1e4);
                fVar120 = *(float *)(bezier_basis0 + lVar26 + 0x1e8);
                lVar26 = lVar22 * 4;
                fVar122 = *(float *)(bezier_basis0 + lVar26 + 0x660);
                fVar34 = *(float *)(bezier_basis0 + lVar26 + 0x664);
                fVar121 = *(float *)(bezier_basis0 + lVar26 + 0x668);
                fVar114 = *(float *)(bezier_basis0 + lVar26 + 0x66c);
                lVar26 = lVar22 * 4;
                fVar117 = *(float *)(bezier_basis0 + lVar26 + 0xae4);
                fVar119 = *(float *)(bezier_basis0 + lVar26 + 0xae8);
                fVar133 = *(float *)(bezier_basis0 + lVar26 + 0xaec);
                fVar137 = *(float *)(bezier_basis0 + lVar26 + 0xaf0);
                lVar26 = lVar22 * 4;
                fVar167 = *(float *)(bezier_basis0 + lVar26 + 0xf68);
                fVar170 = *(float *)(bezier_basis0 + lVar26 + 0xf6c);
                fVar163 = *(float *)(bezier_basis0 + lVar26 + 0xf70);
                fVar146 = *(float *)(bezier_basis0 + lVar26 + 0xf74);
                auVar49._0_4_ =
                     fVar35 * fVar100 + fVar66 * fVar122 + fVar32 * fVar117 + fVar36 * fVar167;
                auVar49._4_4_ =
                     fVar35 * fVar33 + fVar66 * fVar34 + fVar32 * fVar119 + fVar36 * fVar170;
                auVar49._8_4_ =
                     fVar35 * fVar118 + fVar66 * fVar121 + fVar32 * fVar133 + fVar36 * fVar163;
                auVar49._12_4_ =
                     fVar35 * fVar120 + fVar66 * fVar114 + fVar32 * fVar137 + fVar36 * fVar146;
                auVar102._0_4_ =
                     fVar60 * fVar100 + fVar80 * fVar122 + fVar130 * fVar117 + fVar61 * fVar167;
                auVar102._4_4_ =
                     fVar60 * fVar33 + fVar80 * fVar34 + fVar130 * fVar119 + fVar61 * fVar170;
                auVar102._8_4_ =
                     fVar60 * fVar118 + fVar80 * fVar121 + fVar130 * fVar133 + fVar61 * fVar163;
                auVar102._12_4_ =
                     fVar60 * fVar120 + fVar80 * fVar114 + fVar130 * fVar137 + fVar61 * fVar146;
                fVar152 = fVar100 * fVar62 + fVar122 * fVar83 + fVar117 * fVar132 + fVar167 * fVar63
                ;
                fVar153 = fVar33 * fVar62 + fVar34 * fVar83 + fVar119 * fVar132 + fVar170 * fVar63;
                fVar155 = fVar118 * fVar62 + fVar121 * fVar83 + fVar133 * fVar132 + fVar163 * fVar63
                ;
                fVar173 = fVar120 * fVar62 + fVar114 * fVar83 + fVar137 * fVar132 + fVar146 * fVar63
                ;
                lVar26 = lVar22 * 4;
                fVar100 = *(float *)(bezier_basis0 + lVar26 + 0x13ec);
                fVar33 = *(float *)(bezier_basis0 + lVar26 + 0x13f0);
                fVar118 = *(float *)(bezier_basis0 + lVar26 + 0x13f4);
                fVar120 = *(float *)(bezier_basis0 + lVar26 + 0x13f8);
                lVar26 = lVar22 * 4;
                fVar122 = *(float *)(bezier_basis0 + lVar26 + 0x1870);
                fVar34 = *(float *)(bezier_basis0 + lVar26 + 0x1874);
                fVar121 = *(float *)(bezier_basis0 + lVar26 + 0x1878);
                fVar114 = *(float *)(bezier_basis0 + lVar26 + 0x187c);
                lVar26 = lVar22 * 4;
                fVar117 = *(float *)(bezier_basis0 + lVar26 + 0x1cf4);
                fVar119 = *(float *)(bezier_basis0 + lVar26 + 0x1cf8);
                fVar133 = *(float *)(bezier_basis0 + lVar26 + 0x1cfc);
                fVar137 = *(float *)(bezier_basis0 + lVar26 + 0x1d00);
                lVar26 = lVar22 * 4;
                fVar167 = *(float *)(bezier_basis0 + lVar26 + 0x2178);
                fVar170 = *(float *)(bezier_basis0 + lVar26 + 0x217c);
                fVar163 = *(float *)(bezier_basis0 + lVar26 + 0x2180);
                fVar146 = *(float *)(bezier_basis0 + lVar26 + 0x2184);
                fVar182 = fVar35 * fVar100 + fVar66 * fVar122 + fVar32 * fVar117 + fVar36 * fVar167;
                fVar183 = fVar35 * fVar33 + fVar66 * fVar34 + fVar32 * fVar119 + fVar36 * fVar170;
                fVar64 = fVar35 * fVar118 + fVar66 * fVar121 + fVar32 * fVar133 + fVar36 * fVar163;
                fVar65 = fVar35 * fVar120 + fVar66 * fVar114 + fVar32 * fVar137 + fVar36 * fVar146;
                fVar105 = fVar60 * fVar100 + fVar80 * fVar122 + fVar130 * fVar117 + fVar61 * fVar167
                ;
                fVar111 = fVar60 * fVar33 + fVar80 * fVar34 + fVar130 * fVar119 + fVar61 * fVar170;
                fVar112 = fVar60 * fVar118 + fVar80 * fVar121 + fVar130 * fVar133 + fVar61 * fVar163
                ;
                fVar113 = fVar60 * fVar120 + fVar80 * fVar114 + fVar130 * fVar137 + fVar61 * fVar146
                ;
                fVar100 = fVar100 * fVar62 + fVar122 * fVar83 + fVar117 * fVar132 + fVar167 * fVar63
                ;
                fVar33 = fVar33 * fVar62 + fVar34 * fVar83 + fVar119 * fVar132 + fVar170 * fVar63;
                fVar118 = fVar118 * fVar62 + fVar121 * fVar83 + fVar133 * fVar132 + fVar163 * fVar63
                ;
                fVar120 = fVar120 * fVar62 + fVar114 * fVar83 + fVar137 * fVar132 + fVar146 * fVar63
                ;
                uVar123 = -(uint)(uVar19 == 0);
                uVar131 = -(uint)(uVar19 == 1);
                uVar134 = -(uint)(uVar19 == 2);
                uVar135 = -(uint)(uVar19 == 3);
                uVar174 = -(uint)(uVar19 == 7);
                uVar176 = -(uint)(uVar19 == 6);
                uVar177 = -(uint)(uVar19 == 5);
                uVar178 = -(uint)(uVar19 == 4);
                auVar180 = minps(_local_368,auVar49);
                auVar179 = maxps(local_338,auVar49);
                auVar150._0_8_ =
                     CONCAT44(auVar49._4_4_ - (float)(~uVar131 & (uint)fVar183) * 0.055555556,
                              auVar49._0_4_ - (float)(~uVar123 & (uint)fVar182) * 0.055555556);
                auVar150._8_4_ = auVar49._8_4_ - (float)(~uVar134 & (uint)fVar64) * 0.055555556;
                auVar150._12_4_ = auVar49._12_4_ - (float)(~uVar135 & (uint)fVar65) * 0.055555556;
                auVar115._0_4_ = (float)(~uVar174 & (uint)fVar105) * 0.055555556 + auVar102._0_4_;
                auVar115._4_4_ = (float)(~uVar176 & (uint)fVar111) * 0.055555556 + auVar102._4_4_;
                auVar115._8_4_ = (float)(~uVar177 & (uint)fVar112) * 0.055555556 + auVar102._8_4_;
                auVar115._12_4_ = (float)(~uVar178 & (uint)fVar113) * 0.055555556 + auVar102._12_4_;
                auVar91 = minps(local_2f8,auVar102);
                auVar107 = maxps(local_2e8,auVar102);
                auVar108._0_8_ =
                     CONCAT44(auVar102._4_4_ - (float)(~uVar131 & (uint)fVar111) * 0.055555556,
                              auVar102._0_4_ - (float)(~uVar123 & (uint)fVar105) * 0.055555556);
                auVar108._8_4_ = auVar102._8_4_ - (float)(~uVar134 & (uint)fVar112) * 0.055555556;
                auVar108._12_4_ = auVar102._12_4_ - (float)(~uVar135 & (uint)fVar113) * 0.055555556;
                auVar158._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
                auVar158._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
                auVar158._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
                auVar158._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
                auVar13._4_4_ = fVar153;
                auVar13._0_4_ = fVar152;
                auVar13._8_4_ = fVar155;
                auVar13._12_4_ = fVar173;
                auVar165._0_4_ = (float)(~uVar174 & (uint)fVar100) * 0.055555556 + fVar152;
                auVar165._4_4_ = (float)(~uVar176 & (uint)fVar33) * 0.055555556 + fVar153;
                auVar165._8_4_ = (float)(~uVar177 & (uint)fVar118) * 0.055555556 + fVar155;
                auVar165._12_4_ = (float)(~uVar178 & (uint)fVar120) * 0.055555556 + fVar173;
                auVar71 = minps(local_318,auVar13);
                auVar90 = maxps(auVar159,auVar13);
                auVar185._0_8_ =
                     CONCAT44(fVar153 - (float)(~uVar131 & (uint)fVar33) * 0.055555556,
                              fVar152 - (float)(~uVar123 & (uint)fVar100) * 0.055555556);
                auVar185._8_4_ = fVar155 - (float)(~uVar134 & (uint)fVar118) * 0.055555556;
                auVar185._12_4_ = fVar173 - (float)(~uVar135 & (uint)fVar120) * 0.055555556;
                auVar124._8_4_ = auVar150._8_4_;
                auVar124._0_8_ = auVar150._0_8_;
                auVar124._12_4_ = auVar150._12_4_;
                auVar12._4_4_ = (float)(~uVar176 & (uint)fVar183) * 0.055555556 + auVar49._4_4_;
                auVar12._0_4_ = (float)(~uVar174 & (uint)fVar182) * 0.055555556 + auVar49._0_4_;
                auVar12._8_4_ = (float)(~uVar177 & (uint)fVar64) * 0.055555556 + auVar49._8_4_;
                auVar12._12_4_ = (float)(~uVar178 & (uint)fVar65) * 0.055555556 + auVar49._12_4_;
                auVar181 = minps(auVar124,auVar12);
                auVar180 = minps(auVar180,auVar181);
                auVar125._8_4_ = auVar108._8_4_;
                auVar125._0_8_ = auVar108._0_8_;
                auVar125._12_4_ = auVar108._12_4_;
                auVar181 = minps(auVar125,auVar115);
                auVar91 = minps(auVar91,auVar181);
                auVar126._8_4_ = auVar185._8_4_;
                auVar126._0_8_ = auVar185._0_8_;
                auVar126._12_4_ = auVar185._12_4_;
                auVar181 = minps(auVar126,auVar165);
                auVar71 = minps(auVar71,auVar181);
                _local_368 = _local_368 & auVar158 | ~auVar158 & auVar180;
                auVar140._0_4_ = local_2f8._0_4_ & auVar158._0_4_;
                auVar140._4_4_ = local_2f8._4_4_ & auVar158._4_4_;
                auVar140._8_4_ = local_2f8._8_4_ & auVar158._8_4_;
                auVar140._12_4_ = local_2f8._12_4_ & auVar158._12_4_;
                local_2f8 = auVar140 | ~auVar158 & auVar91;
                auVar127._0_4_ = ~auVar158._0_4_ & auVar71._0_4_;
                auVar127._4_4_ = ~auVar158._4_4_ & auVar71._4_4_;
                auVar127._8_4_ = ~auVar158._8_4_ & auVar71._8_4_;
                auVar127._12_4_ = ~auVar158._12_4_ & auVar71._12_4_;
                auVar103._0_4_ = local_318._0_4_ & auVar158._0_4_;
                auVar103._4_4_ = local_318._4_4_ & auVar158._4_4_;
                auVar103._8_4_ = local_318._8_4_ & auVar158._8_4_;
                auVar103._12_4_ = local_318._12_4_ & auVar158._12_4_;
                local_318 = auVar103 | auVar127;
                auVar71 = maxps(auVar150,auVar12);
                auVar91 = maxps(auVar179,auVar71);
                auVar71 = maxps(auVar108,auVar115);
                auVar179 = maxps(auVar107,auVar71);
                auVar71 = maxps(auVar185,auVar165);
                auVar71 = maxps(auVar90,auVar71);
                uVar19 = local_338._0_4_ & auVar158._0_4_ | ~auVar158._0_4_ & auVar91._0_4_;
                uVar123 = local_338._4_4_ & auVar158._4_4_ | ~auVar158._4_4_ & auVar91._4_4_;
                uVar131 = local_338._8_4_ & auVar158._8_4_ | ~auVar158._8_4_ & auVar91._8_4_;
                local_338._12_4_ =
                     local_338._12_4_ & auVar158._12_4_ | ~auVar158._12_4_ & auVar91._12_4_;
                local_338._4_4_ = uVar123;
                local_338._0_4_ = uVar19;
                local_338._8_4_ = uVar131;
                uVar134 = local_2e8._0_4_ & auVar158._0_4_ | ~auVar158._0_4_ & auVar179._0_4_;
                uVar135 = local_2e8._4_4_ & auVar158._4_4_ | ~auVar158._4_4_ & auVar179._4_4_;
                uVar174 = local_2e8._8_4_ & auVar158._8_4_ | ~auVar158._8_4_ & auVar179._8_4_;
                local_2e8._12_4_ =
                     local_2e8._12_4_ & auVar158._12_4_ | ~auVar158._12_4_ & auVar179._12_4_;
                local_2e8._4_4_ = uVar135;
                local_2e8._0_4_ = uVar134;
                local_2e8._8_4_ = uVar174;
                local_358 = auVar159._0_4_;
                uStack_354 = auVar159._4_4_;
                uStack_350 = auVar159._8_4_;
                uStack_34c = auVar159._12_4_;
                auVar50._0_4_ = local_358 & auVar158._0_4_;
                auVar50._4_4_ = uStack_354 & auVar158._4_4_;
                auVar50._8_4_ = uStack_350 & auVar158._8_4_;
                auVar50._12_4_ = uStack_34c & auVar158._12_4_;
                auVar159._0_4_ = ~auVar158._0_4_ & auVar71._0_4_;
                auVar159._4_4_ = ~auVar158._4_4_ & auVar71._4_4_;
                auVar159._8_4_ = ~auVar158._8_4_ & auVar71._8_4_;
                auVar159._12_4_ = ~auVar158._12_4_ & auVar71._12_4_;
                auVar159 = auVar159 | auVar50;
                lVar22 = lVar22 + 4;
              } while (lVar22 == 4);
              auVar70 = minps(auVar44,auVar70);
              auVar104._8_4_ = auVar70._0_4_;
              auVar104._12_4_ = 0;
              auVar70 = maxps(auVar48,auVar156);
              auVar109._8_4_ = auVar70._0_4_;
              auVar109._12_4_ = 0;
              auVar51._4_4_ = local_368._0_4_;
              auVar51._0_4_ = local_368._4_4_;
              auVar51._8_4_ = local_368._12_4_;
              auVar51._12_4_ = local_368._8_4_;
              auVar70 = minps(auVar51,_local_368);
              auVar74._0_8_ = auVar70._8_8_;
              auVar74._8_4_ = auVar70._0_4_;
              auVar74._12_4_ = auVar70._4_4_;
              auVar156 = minps(auVar74,auVar70);
              auVar52._4_4_ = local_2f8._0_4_;
              auVar52._0_4_ = local_2f8._4_4_;
              auVar52._8_4_ = local_2f8._12_4_;
              auVar52._12_4_ = local_2f8._8_4_;
              auVar70 = minps(auVar52,local_2f8);
              auVar94._0_8_ = auVar70._8_8_;
              auVar94._8_4_ = auVar70._0_4_;
              auVar94._12_4_ = auVar70._4_4_;
              auVar71 = minps(auVar94,auVar70);
              auVar53._4_4_ = local_318._0_4_;
              auVar53._0_4_ = local_318._4_4_;
              auVar53._8_4_ = local_318._12_4_;
              auVar53._12_4_ = local_318._8_4_;
              auVar70 = minps(auVar53,local_318);
              auVar75._0_8_ = auVar70._8_8_;
              auVar75._8_4_ = auVar70._0_4_;
              auVar75._12_4_ = auVar70._4_4_;
              auVar70 = minps(auVar75,auVar70);
              auVar95._4_4_ = auVar71._0_4_;
              auVar95._0_4_ = auVar156._0_4_;
              auVar95._8_4_ = auVar70._0_4_;
              auVar95._12_4_ = 0;
              auVar90 = minps(auVar104,auVar95);
              auVar54._4_4_ = uVar19;
              auVar54._0_4_ = uVar123;
              auVar54._8_4_ = local_338._12_4_;
              auVar54._12_4_ = uVar131;
              auVar70 = maxps(auVar54,local_338);
              auVar76._0_8_ = auVar70._8_8_;
              auVar76._8_4_ = auVar70._0_4_;
              auVar76._12_4_ = auVar70._4_4_;
              auVar156 = maxps(auVar76,auVar70);
              auVar55._4_4_ = uVar134;
              auVar55._0_4_ = uVar135;
              auVar55._8_4_ = local_2e8._12_4_;
              auVar55._12_4_ = uVar174;
              auVar70 = maxps(auVar55,local_2e8);
              auVar96._0_8_ = auVar70._8_8_;
              auVar96._8_4_ = auVar70._0_4_;
              auVar96._12_4_ = auVar70._4_4_;
              auVar71 = maxps(auVar96,auVar70);
              auVar56._4_4_ = auVar159._0_4_;
              auVar56._0_4_ = auVar159._4_4_;
              auVar56._8_4_ = auVar159._12_4_;
              auVar56._12_4_ = auVar159._8_4_;
              auVar70 = maxps(auVar56,auVar159);
              auVar77._0_8_ = auVar70._8_8_;
              auVar77._8_4_ = auVar70._0_4_;
              auVar77._12_4_ = auVar70._4_4_;
              auVar70 = maxps(auVar77,auVar70);
              auVar97._4_4_ = auVar71._0_4_;
              auVar97._0_4_ = auVar156._0_4_;
              auVar97._8_4_ = auVar70._0_4_;
              auVar97._12_4_ = 0;
              auVar70 = maxps(auVar109,auVar97);
              auVar110._0_4_ = -(uint)(auVar70._0_4_ < fVar30 && -1.844e+18 < auVar90._0_4_);
              auVar110._4_4_ = -(uint)(auVar70._4_4_ < fVar88 && -1.844e+18 < auVar90._4_4_);
              auVar110._8_4_ = -(uint)(auVar70._8_4_ < fVar69 && -1.844e+18 < auVar90._8_4_);
              auVar110._12_4_ = -(uint)(auVar70._12_4_ < fVar89 && -1.844e+18 < auVar90._12_4_);
              uVar24 = movmskps((int)lVar18,auVar110);
              if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab54b8;
              uVar20 = uVar20 + 1;
              bVar9 = (ulong)(long)(int)uVar21 < uVar20;
            } while (uVar20 <= (ulong)(long)(int)uVar21);
          }
          local_f0.primID = &local_e0;
          fVar31 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.lower;
          fVar69 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.upper - fVar31;
          fVar89 = (fVar4 - fVar31) / fVar69;
          fVar69 = (fVar3 - fVar31) / fVar69;
          fVar30 = fVar147 * fVar89;
          fVar66 = fVar147 * fVar69;
          local_f0.this = this;
          local_e0 = uVar28;
          fVar31 = floorf(fVar30);
          fVar88 = ceilf(fVar66);
          uVar29 = (uint)fVar31;
          if (fVar31 <= 0.0) {
            fVar31 = 0.0;
          }
          fVar80 = fVar88;
          if (fVar147 <= fVar88) {
            fVar80 = fVar147;
          }
          if ((int)uVar29 < 0) {
            uVar29 = 0xffffffff;
          }
          iVar23 = (int)fVar147 + 1;
          if ((int)fVar88 < (int)fVar147 + 1) {
            iVar23 = (int)fVar88;
          }
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_b8.field_1,&local_f0,(long)(int)fVar31);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_d8.field_1,&local_f0,(long)(int)fVar80);
          if (iVar23 - uVar29 == 1) {
            fVar147 = fVar30 - fVar31;
            if (fVar30 - fVar31 <= 0.0) {
              fVar147 = 0.0;
            }
            fVar31 = 1.0 - fVar147;
            auVar141._0_4_ = fVar31 * local_b8.m128[0] + fVar147 * local_d8.m128[0];
            auVar141._4_4_ = fVar31 * local_b8.m128[1] + fVar147 * local_d8.m128[1];
            auVar141._8_4_ = fVar31 * local_b8.m128[2] + fVar147 * local_d8.m128[2];
            auVar141._12_4_ = fVar31 * local_b8.m128[3] + fVar147 * local_d8.m128[3];
            auVar128._0_4_ = fVar31 * local_a8 + fVar147 * local_c8;
            auVar128._4_4_ = fVar31 * fStack_a4 + fVar147 * fStack_c4;
            auVar128._8_4_ = fVar31 * fStack_a0 + fVar147 * fStack_c0;
            auVar128._12_4_ = fVar31 * fStack_9c + fVar147 * fStack_bc;
            fVar147 = fVar80 - fVar66;
            if (fVar80 - fVar66 <= 0.0) {
              fVar147 = 0.0;
            }
            fVar31 = 1.0 - fVar147;
            auVar57._0_4_ = local_d8.m128[0] * fVar31 + local_b8.m128[0] * fVar147;
            auVar57._4_4_ = local_d8.m128[1] * fVar31 + local_b8.m128[1] * fVar147;
            auVar57._8_4_ = local_d8.m128[2] * fVar31 + local_b8.m128[2] * fVar147;
            auVar57._12_4_ = local_d8.m128[3] * fVar31 + local_b8.m128[3] * fVar147;
            auVar78._0_4_ = fVar31 * local_c8 + fVar147 * local_a8;
            auVar78._4_4_ = fVar31 * fStack_c4 + fVar147 * fStack_a4;
            auVar78._8_4_ = fVar31 * fStack_c0 + fVar147 * fStack_a0;
            auVar78._12_4_ = fVar31 * fStack_bc + fVar147 * fStack_9c;
            uVar19 = 1;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_f0,(long)((int)fVar31 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_f0,(long)((int)fVar80 + -1));
            fVar88 = fVar30 - fVar31;
            if (fVar30 - fVar31 <= 0.0) {
              fVar88 = 0.0;
            }
            fVar31 = 1.0 - fVar88;
            auVar141._0_4_ = local_b8.m128[0] * fVar31 + local_58.m128[0] * fVar88;
            auVar141._4_4_ = local_b8.m128[1] * fVar31 + local_58.m128[1] * fVar88;
            auVar141._8_4_ = local_b8.m128[2] * fVar31 + local_58.m128[2] * fVar88;
            auVar141._12_4_ = local_b8.m128[3] * fVar31 + local_58.m128[3] * fVar88;
            auVar128._0_4_ = fVar31 * local_a8 + fVar88 * local_48;
            auVar128._4_4_ = fVar31 * fStack_a4 + fVar88 * fStack_44;
            auVar128._8_4_ = fVar31 * fStack_a0 + fVar88 * fStack_40;
            auVar128._12_4_ = fVar31 * fStack_9c + fVar88 * fStack_3c;
            fVar31 = fVar80 - fVar66;
            if (fVar80 - fVar66 <= 0.0) {
              fVar31 = 0.0;
            }
            fVar30 = 1.0 - fVar31;
            auVar151._0_8_ =
                 CONCAT44(local_d8.m128[1] * fVar30 + local_78.m128[1] * fVar31,
                          local_d8.m128[0] * fVar30 + local_78.m128[0] * fVar31);
            auVar151._8_4_ = local_d8.m128[2] * fVar30 + local_78.m128[2] * fVar31;
            auVar151._12_4_ = local_d8.m128[3] * fVar30 + local_78.m128[3] * fVar31;
            auVar116._0_8_ =
                 CONCAT44(fVar30 * fStack_c4 + fVar31 * fStack_64,
                          fVar30 * local_c8 + fVar31 * local_68);
            auVar116._8_4_ = fVar30 * fStack_c0 + fVar31 * fStack_60;
            auVar116._12_4_ = fVar30 * fStack_bc + fVar31 * fStack_5c;
            uVar19 = uVar29 + 1;
            if ((int)uVar19 < iVar23) {
              sVar27 = (size_t)uVar19;
              iVar23 = ~uVar29 + iVar23;
              do {
                fVar31 = ((float)(int)sVar27 / fVar147 - fVar89) / (fVar69 - fVar89);
                fVar30 = 1.0 - fVar31;
                fVar83 = auVar141._4_4_;
                fVar32 = auVar141._8_4_;
                fVar130 = auVar141._12_4_;
                fVar88 = auVar128._4_4_;
                fVar66 = auVar128._8_4_;
                fVar80 = auVar128._12_4_;
                pBVar16 = linearBounds::anon_class_16_2_07cfa4d6::operator()
                                    ((BBox3fa *)&local_98.field_1,&local_f0,sVar27);
                uVar19 = (uint)pBVar16;
                auVar58._0_4_ =
                     local_98.m128[0] - (auVar141._0_4_ * fVar30 + auVar151._0_4_ * fVar31);
                auVar58._4_4_ = local_98.m128[1] - (fVar83 * fVar30 + auVar151._4_4_ * fVar31);
                auVar58._8_4_ = local_98.m128[2] - (fVar32 * fVar30 + auVar151._8_4_ * fVar31);
                auVar58._12_4_ = local_98.m128[3] - (fVar130 * fVar30 + auVar151._12_4_ * fVar31);
                auVar79._0_4_ = local_88 - (fVar30 * auVar128._0_4_ + fVar31 * auVar116._0_4_);
                auVar79._4_4_ = fStack_84 - (fVar30 * fVar88 + fVar31 * auVar116._4_4_);
                auVar79._8_4_ = fStack_80 - (fVar30 * fVar66 + fVar31 * auVar116._8_4_);
                auVar79._12_4_ = fStack_7c - (fVar30 * fVar80 + fVar31 * auVar116._12_4_);
                auVar70 = minps(auVar58,ZEXT816(0));
                auVar156 = maxps(auVar79,ZEXT816(0));
                auVar141._0_4_ = auVar141._0_4_ + auVar70._0_4_;
                auVar141._4_4_ = fVar83 + auVar70._4_4_;
                auVar141._8_4_ = fVar32 + auVar70._8_4_;
                auVar141._12_4_ = fVar130 + auVar70._12_4_;
                auVar57._0_8_ =
                     CONCAT44(auVar70._4_4_ + auVar151._4_4_,auVar70._0_4_ + auVar151._0_4_);
                auVar57._8_4_ = auVar70._8_4_ + auVar151._8_4_;
                auVar57._12_4_ = auVar70._12_4_ + auVar151._12_4_;
                auVar128._0_4_ = auVar128._0_4_ + auVar156._0_4_;
                auVar128._4_4_ = fVar88 + auVar156._4_4_;
                auVar128._8_4_ = fVar66 + auVar156._8_4_;
                auVar128._12_4_ = fVar80 + auVar156._12_4_;
                auVar78._0_8_ =
                     CONCAT44(auVar156._4_4_ + auVar116._4_4_,auVar156._0_4_ + auVar116._0_4_);
                auVar78._8_4_ = auVar156._8_4_ + auVar116._8_4_;
                auVar78._12_4_ = auVar156._12_4_ + auVar116._12_4_;
                sVar27 = sVar27 + 1;
                auVar116._8_4_ = auVar78._8_4_;
                auVar116._0_8_ = auVar78._0_8_;
                auVar116._12_4_ = auVar78._12_4_;
                auVar151._8_4_ = auVar57._8_4_;
                auVar151._0_8_ = auVar57._0_8_;
                auVar151._12_4_ = auVar57._12_4_;
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            else {
              auVar57._8_4_ = auVar151._8_4_;
              auVar57._0_8_ = auVar151._0_8_;
              auVar57._12_4_ = auVar151._12_4_;
              auVar78._8_4_ = auVar116._8_4_;
              auVar78._0_8_ = auVar116._0_8_;
              auVar78._12_4_ = auVar116._12_4_;
            }
          }
          auVar98._4_4_ = -(uint)(auVar141._4_4_ <= auVar128._4_4_);
          auVar98._0_4_ = -(uint)(auVar141._0_4_ <= auVar128._0_4_);
          auVar98._8_4_ = -(uint)(auVar141._8_4_ <= auVar128._8_4_);
          auVar98._12_4_ = -(uint)(auVar141._12_4_ <= auVar128._12_4_);
          uVar24 = movmskps(uVar19,auVar98);
          if (((~(byte)uVar24 & 7) == 0) &&
             (auVar99._4_4_ = -(uint)(auVar57._4_4_ <= auVar78._4_4_),
             auVar99._0_4_ = -(uint)(auVar57._0_4_ <= auVar78._0_4_),
             auVar99._8_4_ = -(uint)(auVar57._8_4_ <= auVar78._8_4_),
             auVar99._12_4_ = -(uint)(auVar57._12_4_ <= auVar78._12_4_),
             uVar24 = movmskps(CONCAT31((int3)((uint)uVar24 >> 8),~(byte)uVar24),auVar99),
             (~(byte)uVar24 & 7) == 0)) {
            auVar156 = minps(auVar141,auVar57);
            auVar70 = maxps(auVar128,auVar78);
            aVar142._0_12_ = auVar156._0_12_;
            aVar142.m128[3] = (float)geomID;
            aVar129._0_12_ = auVar70._0_12_;
            aVar129.m128[3] = (float)uVar28;
            auVar59._0_4_ = auVar156._0_4_ + auVar70._0_4_;
            auVar59._4_4_ = auVar156._4_4_ + auVar70._4_4_;
            auVar59._8_4_ = auVar156._8_4_ + auVar70._8_4_;
            auVar59._12_4_ = (float)geomID + (float)uVar28;
            local_1e8 = minps(local_1e8,(undefined1  [16])aVar142);
            local_1f8 = maxps(local_1f8,(undefined1  [16])aVar129);
            local_208 = minps(local_208,auVar59);
            local_218 = maxps(local_218,auVar59);
            local_250 = local_250 + 1;
            prims[local_248].lower.field_0 = aVar142;
            prims[local_248].upper.field_0 = aVar129;
            local_248 = local_248 + 1;
          }
        }
LAB_00ab5961:
        uVar28 = uVar28 + 1;
      } while (uVar28 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_1e8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_1e8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_1f8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_1f8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_208._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_208._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_218._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_218._8_8_;
    __return_storage_ptr__->end = local_250;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }